

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O2

InnerClasses_attribute __thiscall ClassLoader::getAttributeInnerClasses(ClassLoader *this,FILE *fp)

{
  Class *pCVar1;
  Class CVar2;
  u2 i;
  ulong uVar3;
  InnerClasses_attribute IVar4;
  
  IVar4.number_of_classes = readU2(this,fp);
  pCVar1 = (Class *)malloc((ulong)IVar4.number_of_classes << 3);
  for (uVar3 = 0; IVar4.number_of_classes != uVar3; uVar3 = uVar3 + 1) {
    CVar2 = getClass(this,fp);
    pCVar1[uVar3] = CVar2;
  }
  IVar4._2_6_ = 0;
  IVar4.classes = pCVar1;
  return IVar4;
}

Assistant:

InnerClasses_attribute ClassLoader::getAttributeInnerClasses(FILE *fp) {
    InnerClasses_attribute result;
    result.number_of_classes = readU2(fp);
    result.classes = (Class*) malloc(sizeof(Class) * result.number_of_classes);
    for (u2 i = 0; i < result.number_of_classes; i++) {
        result.classes[i] = getClass(fp);
    }
    return result;
}